

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QRegion __thiscall QMdiSubWindowPrivate::getRegion(QMdiSubWindowPrivate *this,Operation operation)

{
  QRegion *this_00;
  long lVar1;
  QWidget *this_01;
  QWidgetData *pQVar2;
  undefined8 uVar3;
  QRect QVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QStyle *pQVar8;
  int in_EDX;
  int i;
  long lVar9;
  int iVar10;
  undefined4 in_register_00000034;
  QMdiSubWindowPrivate *this_02;
  QStyleOptionTitleBar *this_03;
  int iVar11;
  int iVar12;
  SubControl *pSVar13;
  int iVar14;
  long in_FS_OFFSET;
  QRect QVar15;
  undefined1 local_c0 [24];
  QStyleOptionTitleBar titleBarOptions;
  
  this_02 = (QMdiSubWindowPrivate *)CONCAT44(in_register_00000034,operation);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWidget **)&(this_02->super_QWidgetPrivate).field_0x8;
  pQVar2 = this_01->data;
  iVar11 = (pQVar2->crect).y2.m_i;
  iVar12 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
  iVar10 = (pQVar2->crect).y1.m_i;
  iVar6 = titleBarHeight(this_02);
  pQVar8 = QWidget::style(this_01);
  iVar7 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x2c,0,this_01);
  iVar14 = iVar6 - iVar7;
  if (in_EDX == 1) {
    titleBarOptions.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ =
         &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption.styleObject =
         (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMdiSubWindowPrivate::titleBarOptions(&titleBarOptions,this_02);
    *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
    lVar9 = 0;
    QRegion::QRegion((QRegion *)this,iVar7,iVar7,iVar12 + iVar7 * -2,iVar14,Rectangle);
    pSVar13 = SubControls;
    this_00 = (QRegion *)(local_c0 + 0x10);
    do {
      if (lVar9 != 0) {
        if (lVar9 == 9) goto LAB_00417bd5;
        pQVar8 = QWidget::style(this_01);
        QVar15 = (QRect)(**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,5,&titleBarOptions,*pSVar13,0);
        local_c0._0_16_ = (undefined1  [16])QVar15;
        QRegion::QRegion(this_00,(QRect *)local_c0,Rectangle);
        QRegion::operator-=((QRegion *)this,this_00);
        QRegion::~QRegion(this_00);
      }
      lVar9 = lVar9 + 1;
      pSVar13 = pSVar13 + 1;
    } while( true );
  }
  *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  pQVar8 = QWidget::style(this_01);
  bVar5 = isMacStyle(pQVar8);
  QVar4.x2.m_i = local_c0._8_4_;
  QVar4.y2.m_i = local_c0._12_4_;
  QVar4.x1.m_i = local_c0._0_4_;
  QVar4.y1.m_i = local_c0._4_4_;
  QVar15.x2.m_i = local_c0._8_4_;
  QVar15.y2.m_i = local_c0._12_4_;
  QVar15.x1.m_i = local_c0._0_4_;
  QVar15.y1.m_i = local_c0._4_4_;
  if ((bVar5) || (QVar15 = QVar4, 7 < in_EDX - 2U)) goto LAB_00417dfe;
  iVar11 = (iVar11 - iVar10) + 1;
  switch(in_EDX) {
  case 2:
    this_03 = &titleBarOptions;
    QRegion::QRegion((QRegion *)this_03,iVar6,0,iVar12 + iVar6 * -2,iVar7,Rectangle);
    uVar3 = *(undefined8 *)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate =
         titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = uVar3;
    break;
  case 3:
    iVar11 = iVar11 - iVar7;
    iVar12 = iVar12 + iVar6 * -2;
    iVar10 = iVar6;
    iVar14 = iVar7;
    goto LAB_00417cf6;
  case 4:
    this_03 = &titleBarOptions;
    QRegion::QRegion((QRegion *)this_03,0,iVar6,iVar7,iVar11 + iVar6 * -2,Rectangle);
    uVar3 = *(undefined8 *)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate =
         titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = uVar3;
    break;
  case 5:
    iVar10 = iVar12 - iVar7;
    iVar14 = iVar11 + iVar6 * -2;
    iVar12 = iVar7;
    iVar11 = iVar6;
LAB_00417cf6:
    this_03 = &titleBarOptions;
    QRegion::QRegion((QRegion *)&titleBarOptions,iVar10,iVar11,iVar12,iVar14,Rectangle);
    uVar3 = *(undefined8 *)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate =
         titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = uVar3;
    break;
  case 6:
    QRegion::QRegion((QRegion *)local_c0,0,0,iVar6,iVar6,Rectangle);
    iVar11 = iVar7;
    goto LAB_00417db5;
  case 7:
    this_03 = (QStyleOptionTitleBar *)local_c0;
    QRegion::QRegion((QRegion *)this_03,iVar12 - iVar6,0,iVar6,iVar6,Rectangle);
    QRegion::QRegion((QRegion *)(local_c0 + 0x10),iVar12 - iVar6,iVar7,iVar14,iVar14,Rectangle);
    QRegion::operator-((QRegion *)&titleBarOptions,(QRegion *)this_03);
    uVar3 = *(undefined8 *)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate =
         titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = uVar3;
    QRegion::~QRegion((QRegion *)&titleBarOptions);
    QRegion::~QRegion((QRegion *)(local_c0 + 0x10));
    break;
  case 8:
    QRegion::QRegion((QRegion *)local_c0,0,iVar11 - iVar6,iVar6,iVar6,Rectangle);
    iVar11 = iVar11 - iVar6;
LAB_00417db5:
    QRegion::QRegion((QRegion *)(local_c0 + 0x10),iVar7,iVar11,iVar14,iVar14,Rectangle);
    QRegion::operator-((QRegion *)&titleBarOptions,(QRegion *)local_c0);
    uVar3 = *(undefined8 *)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate =
         titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = uVar3;
    QRegion::~QRegion((QRegion *)&titleBarOptions);
LAB_00417df1:
    this_03 = (QStyleOptionTitleBar *)local_c0;
    QRegion::~QRegion((QRegion *)(local_c0 + 0x10));
    break;
  case 9:
    QRegion::QRegion((QRegion *)local_c0,iVar12 - iVar6,iVar11 - iVar6,iVar6,iVar6,Rectangle);
    QRegion::QRegion((QRegion *)(local_c0 + 0x10),iVar12 - iVar6,iVar11 - iVar6,iVar14,iVar14,
                     Rectangle);
    QRegion::operator-((QRegion *)&titleBarOptions,(QRegion *)local_c0);
    uVar3 = *(undefined8 *)&this->super_QWidgetPrivate;
    *(undefined8 *)&this->super_QWidgetPrivate =
         titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    titleBarOptions.super_QStyleOptionComplex.super_QStyleOption._0_8_ = uVar3;
    QRegion::~QRegion((QRegion *)&titleBarOptions);
    goto LAB_00417df1;
  }
  QRegion::~QRegion((QRegion *)this_03);
  QVar15.x2.m_i = local_c0._8_4_;
  QVar15.y2.m_i = local_c0._12_4_;
  QVar15.x1.m_i = local_c0._0_4_;
  QVar15.y1.m_i = local_c0._4_4_;
LAB_00417dfe:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    local_c0._0_16_ = (undefined1  [16])QVar15;
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
LAB_00417bd5:
  QStyleOptionTitleBar::~QStyleOptionTitleBar(&titleBarOptions);
  QVar15 = (QRect)local_c0._0_16_;
  goto LAB_00417dfe;
}

Assistant:

QRegion QMdiSubWindowPrivate::getRegion(Operation operation) const
{
    Q_Q(const QMdiSubWindow);
    int width = q->width();
    int height = q->height();
    int titleBarHeight = this->titleBarHeight();
    int frameWidth = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);
    int cornerConst = titleBarHeight - frameWidth;
    int titleBarConst = 2 * titleBarHeight;

    if (operation == Move) {
        QStyleOptionTitleBar titleBarOptions = this->titleBarOptions();
        QRegion move(frameWidth, frameWidth, width - 2 * frameWidth, cornerConst);
        // Depending on which window flags are set, activated sub controllers will
        // be subtracted from the 'move' region.
        for (int i = 0; i < NumSubControls; ++i) {
            if (SubControls[i] == QStyle::SC_TitleBarLabel)
                continue;
            move -= QRegion(q->style()->subControlRect(QStyle::CC_TitleBar, &titleBarOptions,
                            SubControls[i]));
        }
        return move;
    }

    QRegion region;
    if (isMacStyle(q->style()))
        return region;

    switch (operation) {
    case TopResize:
        region = QRegion(titleBarHeight, 0, width - titleBarConst, frameWidth);
        break;
    case BottomResize:
        region = QRegion(titleBarHeight, height - frameWidth, width - titleBarConst, frameWidth);
        break;
    case LeftResize:
        region = QRegion(0, titleBarHeight, frameWidth, height - titleBarConst);
        break;
    case RightResize:
        region = QRegion(width - frameWidth, titleBarHeight, frameWidth, height - titleBarConst);
        break;
    case TopLeftResize:
        region = QRegion(0, 0, titleBarHeight, titleBarHeight)
                 - QRegion(frameWidth, frameWidth, cornerConst, cornerConst);
        break;
    case TopRightResize:
        region =  QRegion(width - titleBarHeight, 0, titleBarHeight, titleBarHeight)
                  - QRegion(width - titleBarHeight, frameWidth, cornerConst, cornerConst);
        break;
    case BottomLeftResize:
        region = QRegion(0, height - titleBarHeight, titleBarHeight, titleBarHeight)
                 - QRegion(frameWidth, height - titleBarHeight, cornerConst, cornerConst);
        break;
    case BottomRightResize:
        region = QRegion(width - titleBarHeight, height - titleBarHeight, titleBarHeight, titleBarHeight)
                 - QRegion(width - titleBarHeight, height - titleBarHeight, cornerConst, cornerConst);
        break;
    default:
        break;
    }

    return region;
}